

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coreaction.cc
# Opt level: O0

SymbolEntry *
ActionConstantPtr::isPointer
          (AddrSpace *spc,Varnode *vn,PcodeOp *op,int4 slot,Address *rampoint,uintb *fullEncoding,
          Funcdata *data)

{
  _Base_ptr p_Var1;
  uintb *addr;
  Varnode *pVVar2;
  bool bVar3;
  type_metatype tVar4;
  uint uVar5;
  OpCode OVar6;
  int4 iVar7;
  Datatype *pDVar8;
  uintb uVar9;
  Address *pAVar10;
  Varnode *pVVar11;
  _Base_ptr p_Var12;
  ScopeLocal *this;
  Scope *this_00;
  Address local_90;
  AddrSpace *local_80;
  SymbolEntry *entry;
  undefined1 local_68 [24];
  Varnode *outvn;
  Architecture *glb;
  pointer ppAStack_40;
  bool needexacthit;
  uintb *fullEncoding_local;
  Address *rampoint_local;
  PcodeOp *pPStack_28;
  int4 slot_local;
  PcodeOp *op_local;
  Varnode *vn_local;
  AddrSpace *spc_local;
  
  ppAStack_40 = (pointer)fullEncoding;
  fullEncoding_local = (uintb *)rampoint;
  rampoint_local._4_4_ = slot;
  pPStack_28 = op;
  op_local = (PcodeOp *)vn;
  vn_local = (Varnode *)spc;
  outvn = (Varnode *)Funcdata::getArch(data);
  pDVar8 = Varnode::getType((Varnode *)op_local);
  tVar4 = Datatype::getMetatype(pDVar8);
  pVVar2 = vn_local;
  pVVar11 = outvn;
  if (tVar4 == TYPE_PTR) {
    uVar9 = Varnode::getOffset((Varnode *)op_local);
    uVar5 = Varnode::getSize((Varnode *)op_local);
    pAVar10 = PcodeOp::getAddr(pPStack_28);
    AddrSpaceManager::resolveConstant
              ((AddrSpaceManager *)local_68,(AddrSpace *)pVVar11,(uintb)pVVar2,(int4)uVar9,
               (Address *)(ulong)uVar5,(uintb *)pAVar10);
    Address::operator=((Address *)fullEncoding_local,(Address *)local_68);
    glb._7_1_ = 0;
  }
  else {
    bVar3 = Varnode::isTypeLock((Varnode *)op_local);
    if (bVar3) {
      return (SymbolEntry *)0x0;
    }
    glb._7_1_ = 1;
    OVar6 = PcodeOp::code(pPStack_28);
    switch(OVar6) {
    case CPUI_COPY:
    case CPUI_INT_EQUAL:
    case CPUI_INT_NOTEQUAL:
    case CPUI_INT_LESS:
    case CPUI_INT_LESSEQUAL:
      break;
    default:
      return (SymbolEntry *)0x0;
    case CPUI_STORE:
      if (rampoint_local._4_4_ != 2) {
        return (SymbolEntry *)0x0;
      }
      break;
    case CPUI_CALL:
    case CPUI_CALLIND:
    case CPUI_RETURN:
      if (((ulong)outvn[2].lociter._M_node & 0x1000000000000) == 0) {
        return (SymbolEntry *)0x0;
      }
      if (rampoint_local._4_4_ == 0) {
        return (SymbolEntry *)0x0;
      }
      break;
    case CPUI_INT_ADD:
      local_68._16_8_ = PcodeOp::getOut(pPStack_28);
      pDVar8 = Varnode::getType((Varnode *)local_68._16_8_);
      tVar4 = Datatype::getMetatype(pDVar8);
      if (tVar4 == TYPE_PTR) {
        pVVar11 = PcodeOp::getIn(pPStack_28,1 - rampoint_local._4_4_);
        pDVar8 = Varnode::getType(pVVar11);
        tVar4 = Datatype::getMetatype(pDVar8);
        if (tVar4 == TYPE_PTR) {
          return (SymbolEntry *)0x0;
        }
        glb._7_1_ = 0;
      }
      else if (((ulong)outvn[2].lociter._M_node & 0x1000000000000) == 0) {
        return (SymbolEntry *)0x0;
      }
    }
    if ((outvn[2].defiter._M_node != (_Base_ptr)0x0) &&
       (p_Var1 = outvn[2].defiter._M_node,
       p_Var12 = (_Base_ptr)Varnode::getOffset((Varnode *)op_local), p_Var12 < p_Var1)) {
      return (SymbolEntry *)0x0;
    }
    uVar9 = Varnode::getOffset((Varnode *)op_local);
    iVar7 = Varnode::getSize((Varnode *)op_local);
    iVar7 = bit_transitions(uVar9,iVar7);
    pVVar2 = vn_local;
    pVVar11 = outvn;
    if (iVar7 < 3) {
      return (SymbolEntry *)0x0;
    }
    uVar9 = Varnode::getOffset((Varnode *)op_local);
    uVar5 = Varnode::getSize((Varnode *)op_local);
    pAVar10 = PcodeOp::getAddr(pPStack_28);
    AddrSpaceManager::resolveConstant
              ((AddrSpaceManager *)&entry,(AddrSpace *)pVVar11,(uintb)pVVar2,(int4)uVar9,
               (Address *)(ulong)uVar5,(uintb *)pAVar10);
    Address::operator=((Address *)fullEncoding_local,(Address *)&entry);
  }
  bVar3 = Address::isInvalid((Address *)fullEncoding_local);
  if (bVar3) {
    spc_local = (AddrSpace *)0x0;
  }
  else {
    this = Funcdata::getScopeLocal(data);
    this_00 = Scope::getParent((Scope *)this);
    addr = fullEncoding_local;
    Address::Address(&local_90);
    local_80 = (AddrSpace *)Scope::queryContainer(this_00,(Address *)addr,1,&local_90);
    if (((glb._7_1_ & 1) != 0) && (local_80 != (AddrSpace *)0x0)) {
      pAVar10 = SymbolEntry::getAddr((SymbolEntry *)local_80);
      bVar3 = Address::operator!=(pAVar10,(Address *)fullEncoding_local);
      if (bVar3) {
        return (SymbolEntry *)0x0;
      }
    }
    spc_local = local_80;
  }
  return (SymbolEntry *)spc_local;
}

Assistant:

SymbolEntry *ActionConstantPtr::isPointer(AddrSpace *spc,Varnode *vn,PcodeOp *op,int4 slot,
					  Address &rampoint,uintb &fullEncoding,Funcdata &data)

{
  bool needexacthit;
  Architecture *glb = data.getArch();
  Varnode *outvn;
  if (vn->getType()->getMetatype() == TYPE_PTR) { // Are we explicitly marked as a pointer
    rampoint = glb->resolveConstant(spc,vn->getOffset(),vn->getSize(),op->getAddr(),fullEncoding);
    needexacthit = false;
  }
  else {
    if (vn->isTypeLock()) return (SymbolEntry *)0; // Locked as NOT a pointer
    needexacthit = true;
    // Check if the constant is involved in a potential pointer expression
    // as the base
    switch(op->code()) {
    case CPUI_RETURN:
    case CPUI_CALL:
    case CPUI_CALLIND:
      // A constant parameter or return value could be a pointer
      if (!glb->infer_pointers)
	return (SymbolEntry *)0;
      if (slot==0)
	return (SymbolEntry *)0;
      break;
    case CPUI_COPY:
    case CPUI_INT_EQUAL:
    case CPUI_INT_NOTEQUAL:
    case CPUI_INT_LESS:
    case CPUI_INT_LESSEQUAL:
      // A comparison with a constant could be a pointer
      break;
    case CPUI_INT_ADD:
      outvn = op->getOut();
      if (outvn->getType()->getMetatype()==TYPE_PTR) {
	// Is there another pointer base in this expression
	if (op->getIn(1-slot)->getType()->getMetatype()==TYPE_PTR)
	  return (SymbolEntry *)0; // If so, we are not a pointer
	// FIXME: need to fully explore additive tree
	needexacthit = false;
      }
      else if (!glb->infer_pointers)
	return (SymbolEntry *)0;
      break;
    case CPUI_STORE:
      if (slot != 2)
	return (SymbolEntry *)0;
      break;
    default:
      return (SymbolEntry *)0;
    }
    // Make sure the constant is in the expected range for a pointer
    if ((glb->pointer_lowerbound != 0)&&(glb->pointer_lowerbound > vn->getOffset()))
      return (SymbolEntry *)0;
    // Check if the constant looks like a single bit or mask
    if (bit_transitions(vn->getOffset(),vn->getSize()) < 3)
      return (SymbolEntry *)0;
    rampoint = glb->resolveConstant(spc,vn->getOffset(),vn->getSize(),op->getAddr(),fullEncoding);
  }

  if (rampoint.isInvalid()) return (SymbolEntry *)0;
    // Since we are looking for a global address
    // Assume it is address tied and use empty usepoint
  SymbolEntry *entry = data.getScopeLocal()->getParent()->queryContainer(rampoint,1,Address());
  if (needexacthit&&(entry != (SymbolEntry *)0)) {
    if (entry->getAddr() != rampoint)
      return (SymbolEntry *)0;
  }
  return entry;
}